

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::BigUnsigned
          (BigUnsigned<4> *this,string_view sv)

{
  char *end;
  int n;
  char *pcVar1;
  char *begin;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  
  begin = sv._M_str;
  uVar2 = sv._M_len;
  this->size_ = 0;
  this->words_[0] = 0;
  this->words_[1] = 0;
  this->words_[2] = 0;
  this->words_[3] = 0;
  end = begin + uVar2;
  pcVar1 = begin;
  if (0 < (long)uVar2 >> 2) {
    pcVar1 = begin + (uVar2 & 0xfffffffffffffffc);
    lVar4 = ((long)uVar2 >> 2) + 1;
    pcVar3 = begin + 3;
    do {
      if (9 < (byte)(pcVar3[-3] - 0x30U)) {
        pcVar3 = pcVar3 + -3;
        goto LAB_00338473;
      }
      if (9 < (byte)(pcVar3[-2] - 0x30U)) {
        pcVar3 = pcVar3 + -2;
        goto LAB_00338473;
      }
      if (9 < (byte)(pcVar3[-1] - 0x30U)) {
        pcVar3 = pcVar3 + -1;
        goto LAB_00338473;
      }
      if (9 < (byte)(*pcVar3 - 0x30U)) goto LAB_00338473;
      lVar4 = lVar4 + -1;
      pcVar3 = pcVar3 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)end - (long)pcVar1;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar3 = end;
      if ((lVar4 != 3) || (pcVar3 = pcVar1, 9 < (byte)(*pcVar1 - 0x30U))) goto LAB_00338473;
      pcVar1 = pcVar1 + 1;
    }
    pcVar3 = pcVar1;
    if (9 < (byte)(*pcVar1 - 0x30U)) goto LAB_00338473;
    pcVar1 = pcVar1 + 1;
  }
  pcVar3 = pcVar1;
  if ((byte)(*pcVar1 - 0x30U) < 10) {
    pcVar3 = end;
  }
LAB_00338473:
  if ((uVar2 != 0 && pcVar3 == end) && (n = ReadDigits(this,begin,end,0x27), 0 < n)) {
    MultiplyByTenToTheNth(this,n);
    return;
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }